

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.h
# Opt level: O0

void __thiscall FIX::Mutex::unlock(Mutex *this)

{
  Mutex *this_local;
  
  if (*(int *)(this + 0x30) < 2) {
    *(int *)(this + 0x30) = *(int *)(this + 0x30) + -1;
    *(undefined8 *)(this + 0x28) = 0;
    pthread_mutex_unlock((pthread_mutex_t *)this);
  }
  else {
    *(int *)(this + 0x30) = *(int *)(this + 0x30) + -1;
  }
  return;
}

Assistant:

void unlock()
  {
#ifdef _MSC_VER
    LeaveCriticalSection( &m_mutex );
#else
    if ( m_count > 1 )
    { m_count--; return ; }
    --m_count;
    m_threadID = 0;
    pthread_mutex_unlock( &m_mutex );
#endif
  }